

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

SourceCodeInfo * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
          (Tables *this,SourceCodeInfo *param_1)

{
  SourceCodeInfo *this_00;
  SourceCodeInfo *result;
  
  this_00 = (SourceCodeInfo *)operator_new(0x30);
  SourceCodeInfo::SourceCodeInfo(this_00);
  result = this_00;
  std::
  vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
  ::emplace_back<google::protobuf::SourceCodeInfo*&>
            ((vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
              *)&this->messages_,&result);
  return result;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.emplace_back(result);
  return result;
}